

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_decoder.c
# Opt level: O1

void lzma_decoder_reset(lzma_coder_conflict8 *coder,void *opt)

{
  uint32_t uVar1;
  int iVar2;
  uint32_t bt_i_6;
  byte bVar3;
  uint32_t bt_i_1;
  probability (*papVar4) [16];
  probability (*papVar5) [64];
  uint32_t bt_i_4;
  long lVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  uint uVar12;
  uint32_t bt_i_5;
  lzma_coder_conflict8 *plVar13;
  uint32_t bt_i_3;
  uint32_t bt_i_2;
  
  bVar3 = (byte)*(undefined4 *)((long)opt + 0x1c);
  uVar9 = -1 << (bVar3 & 0x1f);
  uVar10 = ~uVar9;
  coder->pos_mask = uVar10;
  uVar1 = *(uint32_t *)((long)opt + 0x14);
  iVar2 = *(int *)((long)opt + 0x18);
  uVar12 = iVar2 + uVar1;
  if (uVar12 < 5) {
    uVar7 = 0;
    plVar13 = coder;
    do {
      lVar6 = 0;
      do {
        plVar13->literal[0][lVar6] = 0x400;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 0x300);
      uVar7 = uVar7 + 1;
      plVar13 = (lzma_coder_conflict8 *)(plVar13->literal + 1);
    } while (uVar7 >> ((byte)uVar12 & 0x1f) == 0);
    coder->literal_context_bits = uVar1;
    coder->literal_pos_mask = ~(-1 << ((byte)iVar2 & 0x1f));
    coder->state = STATE_LIT_LIT;
    coder->rep0 = 0;
    coder->rep1 = 0;
    coder->rep2 = 0;
    coder->rep3 = 0;
    coder->pos_mask = uVar10;
    (coder->rc).range = 0xffffffff;
    (coder->rc).code = 0;
    (coder->rc).init_bytes_left = 5;
    papVar4 = coder->is_rep0_long;
    lVar6 = 0;
    do {
      uVar11 = 0;
      do {
        papVar4[-0xf][uVar11] = 0x400;
        (*papVar4)[uVar11] = 0x400;
        uVar11 = uVar11 + 1;
      } while (-uVar9 != uVar11);
      coder->is_rep[lVar6] = 0x400;
      coder->is_rep0[lVar6] = 0x400;
      coder->is_rep1[lVar6] = 0x400;
      coder->is_rep2[lVar6] = 0x400;
      lVar6 = lVar6 + 1;
      papVar4 = papVar4 + 1;
    } while (lVar6 != 0xc);
    papVar5 = coder->pos_slot;
    lVar6 = 0;
    do {
      lVar8 = 0;
      do {
        (*papVar5)[lVar8] = 0x400;
        lVar8 = lVar8 + 1;
      } while (lVar8 != 0x40);
      lVar6 = lVar6 + 1;
      papVar5 = papVar5 + 1;
    } while (lVar6 != 4);
    lVar6 = 0;
    do {
      coder->pos_special[lVar6] = 0x400;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x72);
    lVar6 = 0;
    do {
      coder->pos_align[lVar6] = 0x400;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x10);
    (coder->match_len_decoder).choice = 0x400;
    (coder->match_len_decoder).choice2 = 0x400;
    (coder->rep_len_decoder).choice = 0x400;
    (coder->rep_len_decoder).choice2 = 0x400;
    uVar12 = 0;
    do {
      lVar6 = 0;
      do {
        (coder->match_len_decoder).low[uVar12][lVar6] = 0x400;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      lVar6 = 0;
      do {
        (coder->match_len_decoder).mid[uVar12][lVar6] = 0x400;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      lVar6 = 0;
      do {
        (coder->rep_len_decoder).low[uVar12][lVar6] = 0x400;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      lVar6 = 0;
      do {
        (coder->rep_len_decoder).mid[uVar12][lVar6] = 0x400;
        lVar6 = lVar6 + 1;
      } while (lVar6 != 8);
      uVar12 = uVar12 + 1;
    } while (uVar12 >> (bVar3 & 0x1f) == 0);
    lVar6 = 0;
    do {
      (coder->match_len_decoder).high[lVar6] = 0x400;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    lVar6 = 0;
    do {
      (coder->rep_len_decoder).high[lVar6] = 0x400;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 0x100);
    coder->sequence = SEQ_BLOCK_HEADER;
    coder->probs = (probability *)0x0;
    coder->symbol = 0;
    coder->limit = 0;
    coder->offset = 0;
    coder->len = 0;
    return;
  }
  __assert_fail("lc + lp <= LZMA_LCLP_MAX",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/fjeremic[P]CMake/Utilities/cmliblzma/liblzma/lzma/lzma_common.h"
                ,0x87,"void literal_init(probability (*)[768], uint32_t, uint32_t)");
}

Assistant:

static void
lzma_decoder_reset(lzma_coder *coder, const void *opt)
{
	uint32_t i, j, pos_state;
	uint32_t num_pos_states;

	const lzma_options_lzma *options = opt;

	// NOTE: We assume that lc/lp/pb are valid since they were
	// successfully decoded with lzma_lzma_decode_properties().

	// Calculate pos_mask. We don't need pos_bits as is for anything.
	coder->pos_mask = (1U << options->pb) - 1;

	// Initialize the literal decoder.
	literal_init(coder->literal, options->lc, options->lp);

	coder->literal_context_bits = options->lc;
	coder->literal_pos_mask = (1U << options->lp) - 1;

	// State
	coder->state = STATE_LIT_LIT;
	coder->rep0 = 0;
	coder->rep1 = 0;
	coder->rep2 = 0;
	coder->rep3 = 0;
	coder->pos_mask = (1U << options->pb) - 1;

	// Range decoder
	rc_reset(coder->rc);

	// Bit and bittree decoders
	for (i = 0; i < STATES; ++i) {
		for (j = 0; j <= coder->pos_mask; ++j) {
			bit_reset(coder->is_match[i][j]);
			bit_reset(coder->is_rep0_long[i][j]);
		}

		bit_reset(coder->is_rep[i]);
		bit_reset(coder->is_rep0[i]);
		bit_reset(coder->is_rep1[i]);
		bit_reset(coder->is_rep2[i]);
	}

	for (i = 0; i < LEN_TO_POS_STATES; ++i)
		bittree_reset(coder->pos_slot[i], POS_SLOT_BITS);

	for (i = 0; i < FULL_DISTANCES - END_POS_MODEL_INDEX; ++i)
		bit_reset(coder->pos_special[i]);

	bittree_reset(coder->pos_align, ALIGN_BITS);

	// Len decoders (also bit/bittree)
	num_pos_states = 1U << options->pb;
	bit_reset(coder->match_len_decoder.choice);
	bit_reset(coder->match_len_decoder.choice2);
	bit_reset(coder->rep_len_decoder.choice);
	bit_reset(coder->rep_len_decoder.choice2);

	for (pos_state = 0; pos_state < num_pos_states; ++pos_state) {
		bittree_reset(coder->match_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->match_len_decoder.mid[pos_state],
				LEN_MID_BITS);

		bittree_reset(coder->rep_len_decoder.low[pos_state],
				LEN_LOW_BITS);
		bittree_reset(coder->rep_len_decoder.mid[pos_state],
				LEN_MID_BITS);
	}

	bittree_reset(coder->match_len_decoder.high, LEN_HIGH_BITS);
	bittree_reset(coder->rep_len_decoder.high, LEN_HIGH_BITS);

	coder->sequence = SEQ_IS_MATCH;
	coder->probs = NULL;
	coder->symbol = 0;
	coder->limit = 0;
	coder->offset = 0;
	coder->len = 0;

	return;
}